

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_expanded_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  pointer pbVar1;
  long lVar2;
  string *psVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  long *plVar7;
  size_type *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *alias;
  pointer pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string tmp;
  stringstream out;
  string local_2c0;
  long *local_2a0;
  undefined8 local_298;
  undefined1 local_290;
  undefined7 uStack_28f;
  undefined8 uStack_288;
  long *local_280;
  char *local_278;
  long local_270 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  string *local_240;
  long *local_238;
  undefined8 local_230;
  long local_228;
  undefined8 uStack_220;
  long *local_218;
  char *local_210;
  long local_208 [2];
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  long local_1a8 [2];
  long alStack_198 [12];
  ios_base local_138 [264];
  
  local_240 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  App::get_display_name_abi_cxx11_(&local_2c0,sub,true);
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[9])(&local_2c0,this,sub);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if (((sub->name_)._M_string_length == 0) &&
     ((sub->aliases_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (sub->aliases_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    *(long *)((long)alStack_198 + *(long *)(local_1a8[0] + -0x18)) =
         (long)((int)(this->super_FormatterBase).column_width_ + 2);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"     aliases: ",0xe);
    pbVar9 = (sub->aliases_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (sub->aliases_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar9 != pbVar1) {
      bVar4 = true;
      do {
        if (!bVar4) {
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        }
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        pbVar9 = pbVar9 + 1;
        bVar4 = false;
      } while (pbVar9 != pbVar1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  }
  paVar10 = &local_2c0.field_2;
  (*(this->super_FormatterBase)._vptr_FormatterBase[4])(&local_2c0,this,sub);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  make_groups_abi_cxx11_(&local_2c0,this,sub,Sub);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[5])(&local_2c0,this,sub,2);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringbuf::str();
  local_218 = local_208;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"\n\n","");
  local_1d8 = local_1c8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"\n","");
  uVar6 = ::std::__cxx11::string::find((char *)&local_260,(ulong)local_218,0);
  if (uVar6 != 0xffffffffffffffff) {
    do {
      ::std::__cxx11::string::replace((ulong)&local_260,uVar6,local_210,(ulong)local_1d8);
      uVar6 = ::std::__cxx11::string::find((char *)&local_260,(ulong)local_218,uVar6 + local_1d0);
    } while (uVar6 != 0xffffffffffffffff);
  }
  if (local_260 == &local_250) {
    local_2c0.field_2._8_8_ = local_250._8_8_;
    local_2c0._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_2c0._M_dataplus._M_p = (pointer)local_260;
  }
  local_2c0.field_2._M_allocated_capacity._1_7_ = local_250._M_allocated_capacity._1_7_;
  local_2c0.field_2._M_local_buf[0] = local_250._M_local_buf[0];
  local_2c0._M_string_length = local_258;
  local_258 = 0;
  local_250._M_local_buf[0] = '\0';
  local_260 = &local_250;
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,
                    CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]) + 1);
  }
  ::std::__cxx11::string::substr((ulong)&local_238,(ulong)&local_2c0);
  ::std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_238);
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  local_2a0 = (long *)&local_290;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_2c0._M_dataplus._M_p,
             local_2c0._M_dataplus._M_p + local_2c0._M_string_length);
  local_280 = local_270;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"\n","");
  local_1f8 = local_1e8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\n  ","");
  uVar6 = ::std::__cxx11::string::find((char *)&local_2a0,(ulong)local_280,0);
  if (uVar6 != 0xffffffffffffffff) {
    do {
      ::std::__cxx11::string::replace((ulong)&local_2a0,uVar6,local_278,(ulong)local_1f8);
      uVar6 = ::std::__cxx11::string::find((char *)&local_2a0,(ulong)local_280,uVar6 + local_1f0);
    } while (uVar6 != 0xffffffffffffffff);
  }
  psVar3 = local_240;
  if (local_2a0 == (long *)&local_290) {
    uStack_220 = uStack_288;
    local_238 = &local_228;
  }
  else {
    local_238 = local_2a0;
  }
  local_228 = CONCAT71(uStack_28f,local_290);
  local_230 = local_298;
  local_298 = 0;
  local_290 = 0;
  local_2a0 = (long *)&local_290;
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_238);
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar8) {
    lVar2 = plVar7[3];
    (psVar3->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&psVar3->field_2 + 8) = lVar2;
  }
  else {
    (psVar3->_M_dataplus)._M_p = (pointer)*plVar7;
    (psVar3->field_2)._M_allocated_capacity = *psVar8;
  }
  psVar3->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  if (local_2a0 != (long *)&local_290) {
    operator_delete(local_2a0,CONCAT71(uStack_28f,local_290) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

inline std::string Formatter::make_expanded(const App *sub) const {
    std::stringstream out;
    out << sub->get_display_name(true) << "\n";

    out << make_description(sub);
    if(sub->get_name().empty() && !sub->get_aliases().empty()) {
        detail::format_aliases(out, sub->get_aliases(), column_width_ + 2);
    }
    out << make_positionals(sub);
    out << make_groups(sub, AppFormatMode::Sub);
    out << make_subcommands(sub, AppFormatMode::Sub);

    // Drop blank spaces
    std::string tmp = detail::find_and_replace(out.str(), "\n\n", "\n");
    tmp = tmp.substr(0, tmp.size() - 1);  // Remove the final '\n'

    // Indent all but the first line (the name)
    return detail::find_and_replace(tmp, "\n", "\n  ") + "\n";
}